

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Apu.cpp
# Opt level: O2

void __thiscall Ay_Apu::run_until(Ay_Apu *this,blip_time_t final_end_time)

{
  Blip_Synth<12,_1> *this_00;
  blargg_ulong bVar1;
  Blip_Buffer *buf;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  osc_t *poVar19;
  bool bVar20;
  int t;
  blargg_ulong bVar21;
  int t_00;
  bool bVar22;
  
  uVar7 = (this->regs[6] & 0x1f) << 5;
  if ((this->regs[6] & 0x1f) == 0) {
    uVar7 = 0x20;
  }
  uVar11 = (uint)this->regs[0xb] << 5 | (uint)this->regs[0xc] << 0xd;
  uVar13 = (ulong)uVar11;
  if (uVar11 == 0) {
    uVar13 = 0x20;
  }
  iVar4 = (int)uVar13;
  if ((this->env).delay == 0) {
    (this->env).delay = iVar4;
  }
  iVar10 = (this->noise).delay;
  bVar1 = (this->noise).lfsr;
  this_00 = &this->synth_;
  lVar14 = 0;
  do {
    if (lVar14 == 3) {
      iVar10 = final_end_time - (this->last_time + (this->env).delay);
      if (-1 < iVar10) {
        iVar6 = (int)((uint)(iVar10 + iVar4) / uVar13);
        uVar11 = (this->env).pos + iVar6;
        uVar7 = uVar11 | 0xffffffe0;
        if ((int)uVar11 < 0) {
          uVar7 = uVar11;
        }
        (this->env).pos = uVar7;
        iVar10 = iVar10 - iVar6 * iVar4;
      }
      (this->env).delay = -iVar10;
      this->last_time = final_end_time;
      return;
    }
    buf = this->oscs[lVar14].output;
    if (buf != (Blip_Buffer *)0x0) {
      poVar19 = this->oscs + lVar14;
      bVar3 = this->regs[7] >> ((byte)lVar14 & 0x1f);
      buf->modified_ = 1;
      iVar6 = poVar19->period;
      bVar20 = (bVar3 & 1) == 0 && iVar6 <= (int)((int)buf->clock_rate_ + 0x4000U >> 0xf);
      uVar11 = (uint)(bVar20 | bVar3);
      iVar18 = this->last_time;
      iVar9 = (this->env).pos;
      iVar12 = final_end_time;
      if ((this->regs[lVar14 + 8] & 0x10) == 0) {
        uVar16 = (uint)(""[this->regs[lVar14 + 8] & 0xf] >> bVar20);
LAB_0062153a:
        if (uVar16 == 0) {
          uVar11 = 9;
        }
      }
      else {
        uVar16 = (uint)((this->env).wave[iVar9] >> bVar20);
        if (-0x21 < iVar9 && (this->regs[0xd] & 1) != 0) goto LAB_0062153a;
        iVar12 = (this->env).delay + iVar18;
        if (final_end_time <= iVar12) {
          iVar12 = final_end_time;
        }
      }
      t = poVar19->delay + iVar18;
      uVar5 = uVar11 & 1;
      if (uVar5 != 0) {
        lVar2 = (long)((final_end_time + -1 + iVar6) - t) / (long)iVar6;
        t = t + (int)lVar2 * iVar6;
        poVar19->phase = poVar19->phase ^ (ushort)lVar2 & 1;
      }
      bVar22 = (uVar11 & 8) != 0;
      t_00 = iVar18 + iVar10;
      if (bVar22) {
        t_00 = final_end_time;
      }
      bVar21 = 1;
      if (!bVar22) {
        bVar21 = bVar1;
      }
      while( true ) {
        iVar8 = iVar12;
        uVar17 = -((bVar21 | uVar11 >> 3) & ((ushort)poVar19->phase | uVar11) & 1) & uVar16;
        iVar12 = uVar17 - (int)poVar19->last_amp;
        if (iVar12 != 0) {
          poVar19->last_amp = (short)uVar17;
          Blip_Synth<12,_1>::offset(this_00,iVar18,iVar12,buf);
        }
        if ((t_00 < iVar8) || (t < iVar8)) {
          iVar18 = uVar17 * 2 - uVar16;
          bVar22 = iVar18 != 0;
          uVar17 = (ushort)poVar19->phase | uVar5;
          do {
            iVar12 = t;
            if (iVar8 < t) {
              iVar12 = iVar8;
            }
            if ((bVar22 & uVar17) == 0) {
              uVar15 = iVar12 - t_00;
              if (-1 < (int)uVar15) {
                t_00 = (t_00 + uVar7 + uVar15) - uVar15 % uVar7;
              }
            }
            else {
              for (; t_00 <= iVar12; t_00 = t_00 + uVar7) {
                if ((bVar21 + 1 & 2) != 0) {
                  iVar18 = -iVar18;
                  Blip_Synth<12,_1>::offset(this_00,t_00,iVar18,buf);
                }
                bVar21 = bVar21 >> 1 ^ -(bVar21 & 1) & 0x12000;
              }
            }
            iVar12 = t_00;
            if (iVar8 < t_00) {
              iVar12 = iVar8;
            }
            if ((bVar22 & bVar21) == 0) {
              for (; t < iVar12; t = t + iVar6) {
                uVar17 = uVar17 ^ 1;
              }
            }
            else {
              for (; t < iVar12; t = t + iVar6) {
                iVar18 = -iVar18;
                Blip_Synth<12,_1>::offset(this_00,t,iVar18,buf);
              }
              uVar17 = (uint)(0 < iVar18);
            }
          } while ((t_00 < iVar8) || (t < iVar8));
          poVar19->last_amp = (short)(iVar18 + uVar16 >> 1);
          if (uVar5 == 0) {
            poVar19->phase = (short)uVar17;
          }
        }
        if (final_end_time <= iVar8) break;
        iVar9 = iVar9 + (uint)(iVar9 < -1) * 0x20 + -0x1f;
        uVar16 = (uint)((this->env).wave[iVar9] >> bVar20);
        iVar12 = iVar8 + iVar4;
        iVar18 = iVar8;
        if (final_end_time <= iVar8 + iVar4) {
          iVar12 = final_end_time;
        }
      }
      poVar19->delay = t - final_end_time;
      if ((uVar11 & 8) == 0) {
        (this->noise).delay = t_00 - final_end_time;
        (this->noise).lfsr = bVar21;
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void Ay_Apu::run_until( blip_time_t final_end_time )
{
	require( final_end_time >= last_time );
	
	// noise period and initial values
	blip_time_t const noise_period_factor = period_factor * 2; // verified
	blip_time_t noise_period = (regs [6] & 0x1F) * noise_period_factor;
	if ( !noise_period )
		noise_period = noise_period_factor;
	blip_time_t const old_noise_delay = noise.delay;
	blargg_ulong const old_noise_lfsr = noise.lfsr;
	
	// envelope period
	blip_time_t const env_period_factor = period_factor * 2; // verified
	blip_time_t env_period = (regs [12] * 0x100L + regs [11]) * env_period_factor;
	if ( !env_period )
		env_period = env_period_factor; // same as period 1 on my AY chip
	if ( !env.delay )
		env.delay = env_period;
	
	// run each osc separately
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t* const osc = &oscs [index];
		int osc_mode = regs [7] >> index;
		
		// output
		Blip_Buffer* const osc_output = osc->output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// period
		int half_vol = 0;
		blip_time_t inaudible_period = (blargg_ulong) (osc_output->clock_rate() +
				inaudible_freq) / (inaudible_freq * 2);
		if ( osc->period <= inaudible_period && !(osc_mode & tone_off) )
		{
			half_vol = 1; // Actually around 60%, but 50% is close enough
			osc_mode |= tone_off;
		}
		
		// envelope
		blip_time_t start_time = last_time;
		blip_time_t end_time   = final_end_time;
		int const vol_mode = regs [0x08 + index];
		int volume = amp_table [vol_mode & 0x0F] >> half_vol;
		int osc_env_pos = env.pos;
		if ( vol_mode & 0x10 )
		{
			volume = env.wave [osc_env_pos] >> half_vol;
			// use envelope only if it's a repeating wave or a ramp that hasn't finished
			if ( !(regs [13] & 1) || osc_env_pos < -32 )
			{
				end_time = start_time + env.delay;
				if ( end_time >= final_end_time )
					end_time = final_end_time;
				
				//if ( !(regs [12] | regs [11]) )
				//  debug_printf( "Used envelope period 0\n" );
			}
			else if ( !volume )
			{
				osc_mode = noise_off | tone_off;
			}
		}
		else if ( !volume )
		{
			osc_mode = noise_off | tone_off;
		}
		
		// tone time
		blip_time_t const period = osc->period;
		blip_time_t time = start_time + osc->delay;
		if ( osc_mode & tone_off ) // maintain tone's phase when off
		{
			blargg_long count = (final_end_time - time + period - 1) / period;
			time += count * period;
			osc->phase ^= count & 1;
		}
		
		// noise time
		blip_time_t ntime = final_end_time;
		blargg_ulong noise_lfsr = 1;
		if ( !(osc_mode & noise_off) )
		{
			ntime = start_time + old_noise_delay;
			noise_lfsr = old_noise_lfsr;
			//if ( (regs [6] & 0x1F) == 0 )
			//  debug_printf( "Used noise period 0\n" );
		}
		
		// The following efficiently handles several cases (least demanding first):
		// * Tone, noise, and envelope disabled, where channel acts as 4-bit DAC
		// * Just tone or just noise, envelope disabled
		// * Envelope controlling tone and/or noise
		// * Tone and noise disabled, envelope enabled with high frequency
		// * Tone and noise together
		// * Tone and noise together with envelope
		
		// This loop only runs one iteration if envelope is disabled. If envelope
		// is being used as a waveform (tone and noise disabled), this loop will
		// still be reasonably efficient since the bulk of it will be skipped.
		while ( 1 )
		{
			// current amplitude
			int amp = 0;
			if ( (osc_mode | osc->phase) & 1 & (osc_mode >> 3 | noise_lfsr) )
				amp = volume;
			{
				int delta = amp - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = amp;
					synth_.offset( start_time, delta, osc_output );
				}
			}
			
			// Run wave and noise interleved with each catching up to the other.
			// If one or both are disabled, their "current time" will be past end time,
			// so there will be no significant performance hit.
			if ( ntime < end_time || time < end_time )
			{
				// Since amplitude was updated above, delta will always be +/- volume,
				// so we can avoid using last_amp every time to calculate the delta.
				int delta = amp * 2 - volume;
				int delta_non_zero = delta != 0;
				int phase = osc->phase | (osc_mode & tone_off); assert( tone_off == 0x01 );
				do
				{
					// run noise
					blip_time_t end = end_time;
					if ( end_time > time ) end = time;
					if ( phase & delta_non_zero )
					{
						while ( ntime <= end ) // must advance *past* time to avoid hang
						{
							int changed = noise_lfsr + 1;
							noise_lfsr = ((blargg_ulong)-(blargg_long)(noise_lfsr & 1) & 0x12000) ^ (noise_lfsr >> 1);
							if ( changed & 2 )
							{
								delta = -delta;
								synth_.offset( ntime, delta, osc_output );
							}
							ntime += noise_period;
						}
					}
					else
					{
						// 20 or more noise periods on average for some music
						blargg_long remain = end - ntime;
						blargg_long count = remain / noise_period;
						if ( remain >= 0 )
							ntime += noise_period + count * noise_period;
					}
					
					// run tone
					end = end_time;
					if ( end_time > ntime ) end = ntime;
					if ( noise_lfsr & delta_non_zero )
					{
						while ( time < end )
						{
							delta = -delta;
							synth_.offset( time, delta, osc_output );
							time += period;
							//phase ^= 1;
						}
						//assert( phase == (delta > 0) );
						phase = unsigned (-delta) >> (CHAR_BIT * sizeof (unsigned) - 1);
						// (delta > 0)
					}
					else
					{
						// loop usually runs less than once
						//SUB_CASE_COUNTER( (time < end) * (end - time + period - 1) / period );
						
						while ( time < end )
						{
							time += period;
							phase ^= 1;
						}
					}
				}
				while ( time < end_time || ntime < end_time );
				
				osc->last_amp = (delta + volume) >> 1;
				if ( !(osc_mode & tone_off) )
					osc->phase = phase;
			}
			
			if ( end_time >= final_end_time )
				break; // breaks first time when envelope is disabled
			
			// next envelope step
			if ( ++osc_env_pos >= 0 )
				osc_env_pos -= 32;
			volume = env.wave [osc_env_pos] >> half_vol;
			
			start_time = end_time;
			end_time += env_period;
			if ( end_time > final_end_time )
				end_time = final_end_time;
		}
		osc->delay = time - final_end_time;
		
		if ( !(osc_mode & noise_off) )
		{
			noise.delay = ntime - final_end_time;
			noise.lfsr = noise_lfsr;
		}
	}
	
	// TODO: optimized saw wave envelope?
	
	// maintain envelope phase
	blip_time_t remain = final_end_time - last_time - env.delay;
	if ( remain >= 0 )
	{
		blargg_long count = (remain + env_period) / env_period;
		env.pos += count;
		if ( env.pos >= 0 )
			env.pos = (env.pos & 31) - 32;
		remain -= count * env_period;
		assert( -remain <= env_period );
	}
	env.delay = -remain;
	assert( env.delay > 0 );
	assert( env.pos < 0 );
	
	last_time = final_end_time;
}